

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::IntersectConstraints
          (LoopDependenceAnalysis *this,Constraint *constraint_0,Constraint *constraint_1,
          SENode *lower_bound,SENode *upper_bound)

{
  int64_t denominator_0;
  long *plVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Constraint *pCVar7;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  SENode *pSVar8;
  undefined4 extraout_var_15;
  SENode *pSVar9;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  SENode *pSVar10;
  undefined4 extraout_var_18;
  SENode *pSVar11;
  undefined4 extraout_var_19;
  SENode *pSVar12;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  SENode *pSVar13;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  long lVar14;
  long lVar15;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  long lVar16;
  long integer;
  long lVar17;
  long lVar18;
  long lVar19;
  Constraint *pCVar20;
  int64_t numerator_0;
  long lVar21;
  long local_80;
  Loop *local_48;
  SENode *local_40;
  SENode *local_38;
  
  iVar4 = (*constraint_0->_vptr_Constraint[9])(constraint_0);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    return constraint_1;
  }
  iVar4 = (*constraint_1->_vptr_Constraint[9])(constraint_1);
  if (CONCAT44(extraout_var_00,iVar4) != 0) {
    return constraint_0;
  }
  iVar4 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
  if ((CONCAT44(extraout_var_01,iVar4) == 0) ||
     (iVar4 = (*constraint_1->_vptr_Constraint[5])(constraint_1),
     CONCAT44(extraout_var_02,iVar4) == 0)) {
    iVar4 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
    if ((CONCAT44(extraout_var_05,iVar4) != 0) &&
       (iVar4 = (*constraint_1->_vptr_Constraint[7])(constraint_1),
       CONCAT44(extraout_var_06,iVar4) != 0)) {
      iVar4 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
      iVar5 = (*constraint_1->_vptr_Constraint[7])(constraint_1);
      bVar3 = SENode::operator==(*(SENode **)(CONCAT44(extraout_var_07,iVar4) + 0x10),
                                 *(SENode **)(CONCAT44(extraout_var_08,iVar5) + 0x10));
      if (!bVar3) goto LAB_005db8b4;
      pSVar8 = *(SENode **)(CONCAT44(extraout_var_07,iVar4) + 0x18);
      pSVar9 = *(SENode **)(CONCAT44(extraout_var_08,iVar5) + 0x18);
      goto LAB_005db8a7;
    }
    iVar4 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
    if (((CONCAT44(extraout_var_09,iVar4) == 0) &&
        (iVar4 = (*constraint_0->_vptr_Constraint[3])(constraint_0),
        CONCAT44(extraout_var_10,iVar4) == 0)) ||
       ((iVar4 = (*constraint_1->_vptr_Constraint[5])(constraint_1),
        CONCAT44(extraout_var_11,iVar4) == 0 &&
        (iVar4 = (*constraint_1->_vptr_Constraint[3])(constraint_1),
        CONCAT44(extraout_var_12,iVar4) == 0)))) {
      iVar4 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
      if (((CONCAT44(extraout_var_35,iVar4) == 0) ||
          ((iVar4 = (*constraint_1->_vptr_Constraint[3])(constraint_1),
           CONCAT44(extraout_var_36,iVar4) == 0 &&
           (iVar4 = (*constraint_1->_vptr_Constraint[5])(constraint_1),
           CONCAT44(extraout_var_37,iVar4) == 0)))) &&
         ((iVar4 = (*constraint_1->_vptr_Constraint[7])(constraint_1),
          CONCAT44(extraout_var_38,iVar4) == 0 ||
          ((iVar4 = (*constraint_0->_vptr_Constraint[3])(constraint_0),
           CONCAT44(extraout_var_39,iVar4) == 0 &&
           (iVar4 = (*constraint_0->_vptr_Constraint[5])(constraint_0),
           CONCAT44(extraout_var_40,iVar4) == 0)))))) {
        return (Constraint *)0x0;
      }
      iVar4 = (*constraint_0->_vptr_Constraint[7])(constraint_0);
      pCVar20 = constraint_1;
      pCVar7 = constraint_0;
      if (CONCAT44(extraout_var_41,iVar4) == 0) {
        pCVar20 = constraint_0;
        pCVar7 = constraint_1;
      }
      iVar5 = (*pCVar7->_vptr_Constraint[7])();
      iVar6 = (*pCVar20->_vptr_Constraint[5])(pCVar20);
      if (CONCAT44(extraout_var_43,iVar6) == 0) {
        iVar6 = (*pCVar20->_vptr_Constraint[3])(pCVar20);
        pSVar8 = *(SENode **)(CONCAT44(extraout_var_44,iVar6) + 0x10);
        iVar6 = (*pCVar20->_vptr_Constraint[3])(pCVar20);
        pSVar9 = *(SENode **)(CONCAT44(extraout_var_45,iVar6) + 0x18);
        iVar6 = (*pCVar20->_vptr_Constraint[3])(pCVar20);
        pSVar10 = *(SENode **)(CONCAT44(extraout_var_47,iVar6) + 0x20);
      }
      else {
        pSVar8 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
        pSVar9 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,-1);
        iVar6 = (*pCVar20->_vptr_Constraint[5])(pCVar20);
        pSVar10 = ScalarEvolutionAnalysis::CreateNegation
                            (&this->scalar_evolution_,
                             *(SENode **)(CONCAT44(extraout_var_46,iVar6) + 0x10));
        pSVar10 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar10);
      }
      plVar1 = *(long **)(CONCAT44(extraout_var_42,iVar5) + 0x10);
      plVar2 = *(long **)(CONCAT44(extraout_var_42,iVar5) + 0x18);
      iVar5 = (*pSVar8->_vptr_SENode[4])(pSVar8);
      if ((((CONCAT44(extraout_var_48,iVar5) != 0) &&
           (iVar5 = (*pSVar9->_vptr_SENode[4])(), CONCAT44(extraout_var_49,iVar5) != 0)) &&
          (iVar5 = (*pSVar10->_vptr_SENode[4])(pSVar10), CONCAT44(extraout_var_50,iVar5) != 0)) &&
         ((lVar17 = (**(code **)(*plVar1 + 0x20))(), lVar17 != 0 &&
          (lVar17 = (**(code **)(*plVar2 + 0x20))(plVar2), lVar17 != 0)))) {
        iVar5 = (*pSVar8->_vptr_SENode[4])(pSVar8);
        lVar17 = *(long *)(CONCAT44(extraout_var_51,iVar5) + 0x30);
        iVar5 = (*pSVar9->_vptr_SENode[4])();
        lVar19 = *(long *)(CONCAT44(extraout_var_52,iVar5) + 0x30);
        iVar5 = (*pSVar10->_vptr_SENode[4])(pSVar10);
        lVar21 = *(long *)(CONCAT44(extraout_var_53,iVar5) + 0x30);
        lVar14 = (**(code **)(*plVar1 + 0x20))();
        lVar14 = *(long *)(lVar14 + 0x30);
        lVar15 = (**(code **)(*plVar2 + 0x20))(plVar2);
        if (lVar19 * *(long *)(lVar15 + 0x30) + lVar17 * lVar14 == lVar21) {
          if (CONCAT44(extraout_var_41,iVar4) != 0) {
            return constraint_0;
          }
          return constraint_1;
        }
        goto LAB_005db8b4;
      }
LAB_005dbec8:
      pCVar7 = make_constraint<spvtools::opt::DependenceNone>(this);
      return pCVar7;
    }
    iVar4 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
    iVar5 = (*constraint_1->_vptr_Constraint[5])(constraint_1);
    if (CONCAT44(extraout_var_13,iVar4) == 0) {
      iVar4 = (*constraint_0->_vptr_Constraint[3])(constraint_0);
      pSVar8 = *(SENode **)(CONCAT44(extraout_var_15,iVar4) + 0x10);
      iVar4 = (*constraint_0->_vptr_Constraint[3])(constraint_0);
      pSVar9 = *(SENode **)(CONCAT44(extraout_var_16,iVar4) + 0x18);
      iVar4 = (*constraint_0->_vptr_Constraint[3])(constraint_0);
      pSVar10 = *(SENode **)(CONCAT44(extraout_var_18,iVar4) + 0x20);
    }
    else {
      pSVar8 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
      pSVar9 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,-1);
      iVar4 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
      pSVar10 = ScalarEvolutionAnalysis::CreateNegation
                          (&this->scalar_evolution_,
                           *(SENode **)(CONCAT44(extraout_var_17,iVar4) + 0x10));
      pSVar10 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar10);
    }
    if (CONCAT44(extraout_var_14,iVar5) == 0) {
      iVar4 = (*constraint_1->_vptr_Constraint[3])(constraint_1);
      pSVar11 = *(SENode **)(CONCAT44(extraout_var_19,iVar4) + 0x10);
      iVar4 = (*constraint_1->_vptr_Constraint[3])(constraint_1);
      pSVar12 = *(SENode **)(CONCAT44(extraout_var_20,iVar4) + 0x18);
      iVar4 = (*constraint_1->_vptr_Constraint[3])(constraint_1);
      pSVar13 = *(SENode **)(CONCAT44(extraout_var_22,iVar4) + 0x20);
    }
    else {
      pSVar11 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
      pSVar12 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,-1);
      iVar4 = (*constraint_1->_vptr_Constraint[5])(constraint_1);
      pSVar13 = ScalarEvolutionAnalysis::CreateNegation
                          (&this->scalar_evolution_,
                           *(SENode **)(CONCAT44(extraout_var_21,iVar4) + 0x10));
      pSVar13 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar13);
    }
    iVar4 = (*pSVar8->_vptr_SENode[4])(pSVar8);
    if (((CONCAT44(extraout_var_23,iVar4) == 0) ||
        (iVar4 = (*pSVar9->_vptr_SENode[4])(), CONCAT44(extraout_var_24,iVar4) == 0)) ||
       ((iVar4 = (*pSVar10->_vptr_SENode[4])(), CONCAT44(extraout_var_25,iVar4) == 0 ||
        (((iVar4 = (*pSVar11->_vptr_SENode[4])(), CONCAT44(extraout_var_26,iVar4) == 0 ||
          (iVar4 = (*pSVar12->_vptr_SENode[4])(), CONCAT44(extraout_var_27,iVar4) == 0)) ||
         (iVar4 = (*pSVar13->_vptr_SENode[4])(pSVar13), CONCAT44(extraout_var_28,iVar4) == 0))))))
    goto LAB_005dbec8;
    iVar4 = (*pSVar8->_vptr_SENode[4])(pSVar8);
    numerator_0 = *(int64_t *)(CONCAT44(extraout_var_29,iVar4) + 0x30);
    iVar4 = (*pSVar9->_vptr_SENode[4])();
    denominator_0 = *(int64_t *)(CONCAT44(extraout_var_30,iVar4) + 0x30);
    iVar4 = (*pSVar10->_vptr_SENode[4])();
    lVar17 = *(long *)(CONCAT44(extraout_var_31,iVar4) + 0x30);
    iVar4 = (*pSVar11->_vptr_SENode[4])();
    lVar19 = *(long *)(CONCAT44(extraout_var_32,iVar4) + 0x30);
    iVar4 = (*pSVar12->_vptr_SENode[4])();
    local_80 = *(int64_t *)(CONCAT44(extraout_var_33,iVar4) + 0x30);
    iVar4 = (*pSVar13->_vptr_SENode[4])(pSVar13);
    lVar21 = *(long *)(CONCAT44(extraout_var_34,iVar4) + 0x30);
    bVar3 = anon_unknown_15::NormalizeAndCompareFractions(numerator_0,denominator_0,lVar19,local_80)
    ;
    if (!bVar3) {
      iVar4 = (*upper_bound->_vptr_SENode[5])(upper_bound);
      if ((CONCAT44(extraout_var_54,iVar4) != 0) &&
         (iVar4 = (*lower_bound->_vptr_SENode[5])(lower_bound), CONCAT44(extraout_var_55,iVar4) != 0
         )) {
        iVar4 = (*lower_bound->_vptr_SENode[5])(lower_bound);
        lVar14 = *(long *)(CONCAT44(extraout_var_56,iVar4) + 0x30);
        iVar4 = (*upper_bound->_vptr_SENode[5])(upper_bound);
        lVar15 = *(long *)(CONCAT44(extraout_var_57,iVar4) + 0x30);
        lVar16 = local_80 * lVar17 - lVar21 * denominator_0;
        lVar18 = local_80 * numerator_0 - lVar19 * denominator_0;
        integer = lVar16 / lVar18;
        if ((local_80 == 0) &&
           (lVar21 = lVar17, lVar19 = numerator_0, local_80 = denominator_0, denominator_0 == 0)) {
          local_80 = 0;
          lVar21 = 0;
          lVar17 = 0;
        }
        else {
          lVar21 = lVar21 - lVar19 * integer;
          lVar17 = lVar21 / local_80;
        }
        if (((lVar16 % lVar18 == 0) && (lVar21 % local_80 == 0)) &&
           ((lVar14 <= integer &&
            (((integer <= lVar15 && (lVar14 <= lVar17)) && (lVar17 <= lVar15)))))) {
          local_38 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,integer);
          local_40 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,lVar17);
          local_48 = constraint_0->loop_;
          pCVar7 = make_constraint<spvtools::opt::DependencePoint,spvtools::opt::SENode*,spvtools::opt::SENode*,spvtools::opt::Loop_const*>
                             (this,&local_38,&local_40,&local_48);
          return pCVar7;
        }
        goto LAB_005db8b4;
      }
      goto LAB_005dbec8;
    }
    if (local_80 != 0 || denominator_0 != 0) {
      lVar19 = local_80;
      numerator_0 = denominator_0;
    }
    bVar3 = anon_unknown_15::NormalizeAndCompareFractions(lVar17,numerator_0,lVar21,lVar19);
  }
  else {
    iVar4 = (*constraint_0->_vptr_Constraint[5])(constraint_0);
    iVar5 = (*constraint_1->_vptr_Constraint[5])(constraint_1);
    pSVar8 = *(SENode **)(CONCAT44(extraout_var_03,iVar4) + 0x10);
    pSVar9 = *(SENode **)(CONCAT44(extraout_var_04,iVar5) + 0x10);
LAB_005db8a7:
    bVar3 = SENode::operator==(pSVar8,pSVar9);
  }
  if (bVar3 != false) {
    return constraint_0;
  }
LAB_005db8b4:
  pCVar7 = make_constraint<spvtools::opt::DependenceEmpty>(this);
  return pCVar7;
}

Assistant:

Constraint* LoopDependenceAnalysis::IntersectConstraints(
    Constraint* constraint_0, Constraint* constraint_1,
    const SENode* lower_bound, const SENode* upper_bound) {
  if (constraint_0->AsDependenceNone()) {
    return constraint_1;
  } else if (constraint_1->AsDependenceNone()) {
    return constraint_0;
  }

  // Both constraints are distances. Either the same distance or independent.
  if (constraint_0->AsDependenceDistance() &&
      constraint_1->AsDependenceDistance()) {
    auto dist_0 = constraint_0->AsDependenceDistance();
    auto dist_1 = constraint_1->AsDependenceDistance();

    if (*dist_0->GetDistance() == *dist_1->GetDistance()) {
      return constraint_0;
    } else {
      return make_constraint<DependenceEmpty>();
    }
  }

  // Both constraints are points. Either the same point or independent.
  if (constraint_0->AsDependencePoint() && constraint_1->AsDependencePoint()) {
    auto point_0 = constraint_0->AsDependencePoint();
    auto point_1 = constraint_1->AsDependencePoint();

    if (*point_0->GetSource() == *point_1->GetSource() &&
        *point_0->GetDestination() == *point_1->GetDestination()) {
      return constraint_0;
    } else {
      return make_constraint<DependenceEmpty>();
    }
  }

  // Both constraints are lines/distances.
  if ((constraint_0->AsDependenceDistance() ||
       constraint_0->AsDependenceLine()) &&
      (constraint_1->AsDependenceDistance() ||
       constraint_1->AsDependenceLine())) {
    auto is_distance_0 = constraint_0->AsDependenceDistance() != nullptr;
    auto is_distance_1 = constraint_1->AsDependenceDistance() != nullptr;

    auto a0 = is_distance_0 ? scalar_evolution_.CreateConstant(1)
                            : constraint_0->AsDependenceLine()->GetA();
    auto b0 = is_distance_0 ? scalar_evolution_.CreateConstant(-1)
                            : constraint_0->AsDependenceLine()->GetB();
    auto c0 =
        is_distance_0
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      constraint_0->AsDependenceDistance()->GetDistance()))
            : constraint_0->AsDependenceLine()->GetC();

    auto a1 = is_distance_1 ? scalar_evolution_.CreateConstant(1)
                            : constraint_1->AsDependenceLine()->GetA();
    auto b1 = is_distance_1 ? scalar_evolution_.CreateConstant(-1)
                            : constraint_1->AsDependenceLine()->GetB();
    auto c1 =
        is_distance_1
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      constraint_1->AsDependenceDistance()->GetDistance()))
            : constraint_1->AsDependenceLine()->GetC();

    if (a0->AsSEConstantNode() && b0->AsSEConstantNode() &&
        c0->AsSEConstantNode() && a1->AsSEConstantNode() &&
        b1->AsSEConstantNode() && c1->AsSEConstantNode()) {
      auto constant_a0 = a0->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b0 = b0->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c0 = c0->AsSEConstantNode()->FoldToSingleValue();

      auto constant_a1 = a1->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b1 = b1->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c1 = c1->AsSEConstantNode()->FoldToSingleValue();

      // a & b can't both be zero, otherwise it wouldn't be line.
      if (NormalizeAndCompareFractions(constant_a0, constant_b0, constant_a1,
                                       constant_b1)) {
        // Slopes are equal, either parallel lines or the same line.

        if (constant_b0 == 0 && constant_b1 == 0) {
          if (NormalizeAndCompareFractions(constant_c0, constant_a0,
                                           constant_c1, constant_a1)) {
            return constraint_0;
          }

          return make_constraint<DependenceEmpty>();
        } else if (NormalizeAndCompareFractions(constant_c0, constant_b0,
                                                constant_c1, constant_b1)) {
          // Same line.
          return constraint_0;
        } else {
          // Parallel lines can't intersect, report independence.
          return make_constraint<DependenceEmpty>();
        }

      } else {
        // Lines are not parallel, therefore, they must intersect.

        // Calculate intersection.
        if (upper_bound->AsSEConstantNode() &&
            lower_bound->AsSEConstantNode()) {
          auto constant_lower_bound =
              lower_bound->AsSEConstantNode()->FoldToSingleValue();
          auto constant_upper_bound =
              upper_bound->AsSEConstantNode()->FoldToSingleValue();

          auto up = constant_b1 * constant_c0 - constant_b0 * constant_c1;
          // Both b or both a can't be 0, so down is never 0
          // otherwise would have entered the parallel line section.
          auto down = constant_b1 * constant_a0 - constant_b0 * constant_a1;

          auto x_coord = up / down;

          int64_t y_coord = 0;
          int64_t arg1 = 0;
          int64_t const_b_to_use = 0;

          if (constant_b1 != 0) {
            arg1 = constant_c1 - constant_a1 * x_coord;
            y_coord = arg1 / constant_b1;
            const_b_to_use = constant_b1;
          } else if (constant_b0 != 0) {
            arg1 = constant_c0 - constant_a0 * x_coord;
            y_coord = arg1 / constant_b0;
            const_b_to_use = constant_b0;
          }

          if (up % down == 0 &&
              arg1 % const_b_to_use == 0 &&  // Coordinates are integers.
              constant_lower_bound <=
                  x_coord &&  // x_coord is within loop bounds.
              x_coord <= constant_upper_bound &&
              constant_lower_bound <=
                  y_coord &&  // y_coord is within loop bounds.
              y_coord <= constant_upper_bound) {
            // Lines intersect at integer coordinates.
            return make_constraint<DependencePoint>(
                scalar_evolution_.CreateConstant(x_coord),
                scalar_evolution_.CreateConstant(y_coord),
                constraint_0->GetLoop());

          } else {
            return make_constraint<DependenceEmpty>();
          }

        } else {
          // Not constants, bail out.
          return make_constraint<DependenceNone>();
        }
      }

    } else {
      // Not constants, bail out.
      return make_constraint<DependenceNone>();
    }
  }

  // One constraint is a line/distance and the other is a point.
  if ((constraint_0->AsDependencePoint() &&
       (constraint_1->AsDependenceLine() ||
        constraint_1->AsDependenceDistance())) ||
      (constraint_1->AsDependencePoint() &&
       (constraint_0->AsDependenceLine() ||
        constraint_0->AsDependenceDistance()))) {
    auto point_0 = constraint_0->AsDependencePoint() != nullptr;

    auto point = point_0 ? constraint_0->AsDependencePoint()
                         : constraint_1->AsDependencePoint();

    auto line_or_distance = point_0 ? constraint_1 : constraint_0;

    auto is_distance = line_or_distance->AsDependenceDistance() != nullptr;

    auto a = is_distance ? scalar_evolution_.CreateConstant(1)
                         : line_or_distance->AsDependenceLine()->GetA();
    auto b = is_distance ? scalar_evolution_.CreateConstant(-1)
                         : line_or_distance->AsDependenceLine()->GetB();
    auto c =
        is_distance
            ? scalar_evolution_.SimplifyExpression(
                  scalar_evolution_.CreateNegation(
                      line_or_distance->AsDependenceDistance()->GetDistance()))
            : line_or_distance->AsDependenceLine()->GetC();

    auto x = point->GetSource();
    auto y = point->GetDestination();

    if (a->AsSEConstantNode() && b->AsSEConstantNode() &&
        c->AsSEConstantNode() && x->AsSEConstantNode() &&
        y->AsSEConstantNode()) {
      auto constant_a = a->AsSEConstantNode()->FoldToSingleValue();
      auto constant_b = b->AsSEConstantNode()->FoldToSingleValue();
      auto constant_c = c->AsSEConstantNode()->FoldToSingleValue();

      auto constant_x = x->AsSEConstantNode()->FoldToSingleValue();
      auto constant_y = y->AsSEConstantNode()->FoldToSingleValue();

      auto left_hand_side = constant_a * constant_x + constant_b * constant_y;

      if (left_hand_side == constant_c) {
        // Point is on line, return point
        return point_0 ? constraint_0 : constraint_1;
      } else {
        // Point not on line, report independence (empty constraint).
        return make_constraint<DependenceEmpty>();
      }

    } else {
      // Not constants, bail out.
      return make_constraint<DependenceNone>();
    }
  }

  return nullptr;
}